

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions.c
# Opt level: O2

_InstInfo * inst_lookup_3dnow(_CodeInfo *ci)

{
  byte bVar1;
  _InstNode in;
  _InstInfo *p_Var2;
  
  in = Table_0F_0F;
  if (0 < ci->codeLen) {
    bVar1 = *ci->code;
    ci->codeLen = ci->codeLen + -1;
    ci->code = ci->code + 1;
    p_Var2 = inst_get_info(in,(uint)bVar1);
    return p_Var2;
  }
  return (_InstInfo *)0x0;
}

Assistant:

_InstInfo* inst_lookup_3dnow(_CodeInfo* ci)
{
	/* Start off from the two escape bytes gates... which is 3DNow! table.*/
	_InstNode in = Table_0F_0F;

	int index;

	/* Make sure we can read a byte off the stream. */
	if (ci->codeLen < 1) return NULL;

	index = *ci->code;

	ci->codeLen -= 1;
	ci->code += 1;
	return inst_get_info(in, index);
}